

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

void __thiscall
cmGeneratorTarget::GetSourceFiles
          (cmGeneratorTarget *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *config)

{
  __node_base *p_Var1;
  size_type *psVar2;
  cmMakefile *this_00;
  pointer pbVar3;
  pointer pbVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  size_t sVar9;
  cmGeneratorExpressionDAGChecker *__x;
  string *entry;
  const_iterator cVar10;
  _Alloc_hider _Var11;
  cmStringRange cVar12;
  vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
  linkInterfaceSourcesEntries;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  debugProperties;
  const_iterator local_140;
  size_type __dnew_1;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniqueSrcs;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  cmGeneratorExpressionDAGChecker dagChecker;
  
  if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
    __assert_fail("this->GetType() != cmStateEnums::INTERFACE_LIBRARY",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmGeneratorTarget.cxx"
                  ,0x385,
                  "void cmGeneratorTarget::GetSourceFiles(std::vector<std::string> &, const std::string &) const"
                 );
  }
  if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == false) {
    cVar12 = cmTarget::GetSourceEntries_abi_cxx11_(this->Target);
    if (cVar12.Begin._M_current._M_current != cVar12.End._M_current._M_current) {
      do {
        local_140 = cVar12.End._M_current;
        dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)0x0;
        dagChecker.Target._M_dataplus._M_p = (pointer)0x0;
        dagChecker.Target._M_string_length = 0;
        cmSystemTools::ExpandListArgument
                  (cVar12.Begin._M_current._M_current,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&dagChecker,false);
        _Var11 = dagChecker.Target._M_dataplus;
        for (__x = dagChecker.Parent; __x != (cmGeneratorExpressionDAGChecker *)_Var11._M_p;
            __x = (cmGeneratorExpressionDAGChecker *)((__x->Target).field_2._M_local_buf + 8)) {
          pcVar8 = ((_Alloc_hider *)&__x->Parent)->_M_p;
          iVar7 = strncmp(pcVar8,"$<TARGET_OBJECTS:",0x11);
          if ((iVar7 != 0) || (pcVar8[(long)((__x->Target)._M_dataplus._M_p + -1)] != '>')) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(files,(value_type *)__x);
            _Var11 = dagChecker.Target._M_dataplus;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dagChecker);
        cVar10._M_current = cVar12.Begin._M_current._M_current + 1;
        cVar12.End._M_current = local_140._M_current;
        cVar12.Begin._M_current = cVar10._M_current;
      } while (cVar10._M_current != local_140._M_current);
    }
  }
  else {
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    debugProperties.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this_00 = this->Makefile;
    psVar2 = &dagChecker.Target._M_string_length;
    uniqueSrcs._M_h._M_buckets = (__buckets_ptr)0x1d;
    dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)psVar2;
    dagChecker.Parent =
         (cmGeneratorExpressionDAGChecker *)
         std::__cxx11::string::_M_create((ulong *)&dagChecker,(ulong)&uniqueSrcs);
    dagChecker.Target._M_string_length = (size_type)uniqueSrcs._M_h._M_buckets;
    builtin_strncpy((char *)((long)&((dagChecker.Parent)->Target)._M_dataplus._M_p + 5),"ARGET_PR",8
                   );
    builtin_strncpy((char *)((long)&((dagChecker.Parent)->Target)._M_string_length + 5),"OPERTIES",8
                   );
    (dagChecker.Parent)->Parent = (cmGeneratorExpressionDAGChecker *)0x45445f454b414d43;
    ((dagChecker.Parent)->Target)._M_dataplus._M_p = (pointer)0x475241545f475542;
    dagChecker.Target._M_dataplus._M_p = (pointer)uniqueSrcs._M_h._M_buckets;
    *(undefined1 *)((long)&(dagChecker.Parent)->Parent + (long)uniqueSrcs._M_h._M_buckets) = 0;
    pcVar8 = cmMakefile::GetDefinition(this_00,(string *)&dagChecker);
    if (dagChecker.Parent != (cmGeneratorExpressionDAGChecker *)psVar2) {
      operator_delete(dagChecker.Parent,dagChecker.Target._M_string_length + 1);
    }
    if (pcVar8 != (char *)0x0) {
      dagChecker.Parent = (cmGeneratorExpressionDAGChecker *)psVar2;
      sVar9 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&dagChecker,pcVar8,pcVar8 + sVar9);
      cmSystemTools::ExpandListArgument((string *)&dagChecker,&debugProperties,false);
      if (dagChecker.Parent != (cmGeneratorExpressionDAGChecker *)psVar2) {
        operator_delete(dagChecker.Parent,dagChecker.Target._M_string_length + 1);
      }
    }
    if (this->DebugSourcesDone == false) {
      std::
      __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                (debugProperties.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 debugProperties.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,"SOURCES");
    }
    if (this->LocalGenerator->GlobalGenerator->ConfigureDoneCMP0026AndCMP0024 == true) {
      this->DebugSourcesDone = true;
    }
    p_Var1 = &uniqueSrcs._M_h._M_before_begin;
    uniqueSrcs._M_h._M_bucket_count = 7;
    uniqueSrcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x53454352554f53;
    uniqueSrcs._M_h._M_buckets = &p_Var1->_M_nxt;
    cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
              (&dagChecker,&this->Target->Name,(string *)&uniqueSrcs,
               (GeneratorExpressionContent *)0x0,(cmGeneratorExpressionDAGChecker *)0x0);
    if ((__node_base *)uniqueSrcs._M_h._M_buckets != p_Var1) {
      operator_delete(uniqueSrcs._M_h._M_buckets,
                      (ulong)((long)&(uniqueSrcs._M_h._M_before_begin._M_nxt)->_M_nxt + 1));
    }
    uniqueSrcs._M_h._M_buckets = &uniqueSrcs._M_h._M_single_bucket;
    uniqueSrcs._M_h._M_bucket_count = 1;
    uniqueSrcs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    uniqueSrcs._M_h._M_element_count = 0;
    uniqueSrcs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    uniqueSrcs._M_h._M_rehash_policy._M_next_resize = 0;
    uniqueSrcs._M_h._M_single_bucket = (__node_base_ptr)0x0;
    bVar5 = processSources(this,(vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                                 *)(this->SourceEntries).
                                   super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)(this->SourceEntries).
                              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                           (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)files,(cmGeneratorExpressionDAGChecker *)&uniqueSrcs,
                           (string *)&dagChecker,SUB81(config,0));
    linkInterfaceSourcesEntries.
    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    linkInterfaceSourcesEntries.
    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    linkInterfaceSourcesEntries.
    super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __dnew_1 = 0x11;
    local_f8._M_allocated_capacity = (size_type)&local_e8;
    local_f8._M_allocated_capacity =
         std::__cxx11::string::_M_create(&local_f8._M_allocated_capacity,(ulong)&__dnew_1);
    local_e8._M_allocated_capacity = __dnew_1;
    *(undefined8 *)local_f8._M_allocated_capacity = 0x4341465245544e49;
    *(char *)(local_f8._M_allocated_capacity + 8) = 'E';
    *(char *)(local_f8._M_allocated_capacity + 9) = '_';
    *(char *)(local_f8._M_allocated_capacity + 10) = 'S';
    *(char *)(local_f8._M_allocated_capacity + 0xb) = 'O';
    *(char *)(local_f8._M_allocated_capacity + 0xc) = 'U';
    *(char *)(local_f8._M_allocated_capacity + 0xd) = 'R';
    *(char *)(local_f8._M_allocated_capacity + 0xe) = 'C';
    *(char *)(local_f8._M_allocated_capacity + 0xf) = 'E';
    *(char *)(local_f8._M_allocated_capacity + 0x10) = 'S';
    local_f8._8_8_ = __dnew_1;
    *(char *)(local_f8._M_allocated_capacity + __dnew_1) = '\0';
    AddInterfaceEntries(this,config,(string *)&local_f8,&linkInterfaceSourcesEntries);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_allocated_capacity != &local_e8) {
      operator_delete((void *)local_f8._M_allocated_capacity,local_e8._M_allocated_capacity + 1);
    }
    pbVar3 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    pbVar4 = (files->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar6 = processSources(this,(vector<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                                 *)linkInterfaceSourcesEntries.
                                   super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)linkInterfaceSourcesEntries.
                              super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                           (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)files,(cmGeneratorExpressionDAGChecker *)&uniqueSrcs,
                           (string *)&dagChecker,SUB81(config,0));
    if ((!bVar5) &&
       ((!bVar6 ||
        ((ulong)((long)(files->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish -
                (long)(files->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) <=
         (ulong)((long)pbVar3 - (long)pbVar4))))) {
      this->LinkImplementationLanguageIsContextDependent = false;
    }
    std::
    for_each<__gnu_cxx::__normal_iterator<cmGeneratorTarget::TargetPropertyEntry*const*,std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>>,ContainerAlgorithms::DefaultDeleter<std::vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>,false>>
              (linkInterfaceSourcesEntries.
               super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               linkInterfaceSourcesEntries.
               super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    if (linkInterfaceSourcesEntries.
        super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(linkInterfaceSourcesEntries.
                      super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)linkInterfaceSourcesEntries.
                            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)linkInterfaceSourcesEntries.
                            super__Vector_base<cmGeneratorTarget::TargetPropertyEntry_*,_std::allocator<cmGeneratorTarget::TargetPropertyEntry_*>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&uniqueSrcs._M_h);
    cmListFileBacktrace::~cmListFileBacktrace(&dagChecker.Backtrace);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&dagChecker.Seen._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Property._M_dataplus._M_p != &dagChecker.Property.field_2) {
      operator_delete(dagChecker.Property._M_dataplus._M_p,
                      dagChecker.Property.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)dagChecker.Target._M_dataplus._M_p != &dagChecker.Target.field_2) {
      operator_delete(dagChecker.Target._M_dataplus._M_p,
                      dagChecker.Target.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&debugProperties);
  }
  return;
}

Assistant:

void cmGeneratorTarget::GetSourceFiles(std::vector<std::string>& files,
                                       const std::string& config) const
{
  assert(this->GetType() != cmStateEnums::INTERFACE_LIBRARY);

  if (!this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    // At configure-time, this method can be called as part of getting the
    // LOCATION property or to export() a file to be include()d.  However
    // there is no cmGeneratorTarget at configure-time, so search the SOURCES
    // for TARGET_OBJECTS instead for backwards compatibility with OLD
    // behavior of CMP0024 and CMP0026 only.

    cmStringRange sourceEntries = this->Target->GetSourceEntries();
    for (cmStringRange::const_iterator i = sourceEntries.begin();
         i != sourceEntries.end(); ++i) {
      std::string const& entry = *i;

      std::vector<std::string> items;
      cmSystemTools::ExpandListArgument(entry, items);
      for (std::vector<std::string>::const_iterator li = items.begin();
           li != items.end(); ++li) {
        if (cmHasLiteralPrefix(*li, "$<TARGET_OBJECTS:") &&
            (*li)[li->size() - 1] == '>') {
          continue;
        }
        files.push_back(*li);
      }
    }
    return;
  }

  std::vector<std::string> debugProperties;
  const char* debugProp =
    this->Makefile->GetDefinition("CMAKE_DEBUG_TARGET_PROPERTIES");
  if (debugProp) {
    cmSystemTools::ExpandListArgument(debugProp, debugProperties);
  }

  bool debugSources = !this->DebugSourcesDone &&
    std::find(debugProperties.begin(), debugProperties.end(), "SOURCES") !=
      debugProperties.end();

  if (this->LocalGenerator->GetGlobalGenerator()->GetConfigureDoneCMP0026()) {
    this->DebugSourcesDone = true;
  }

  cmGeneratorExpressionDAGChecker dagChecker(this->GetName(), "SOURCES",
                                             CM_NULLPTR, CM_NULLPTR);

  CM_UNORDERED_SET<std::string> uniqueSrcs;
  bool contextDependentDirectSources =
    processSources(this, this->SourceEntries, files, uniqueSrcs, &dagChecker,
                   config, debugSources);

  std::vector<cmGeneratorTarget::TargetPropertyEntry*>
    linkInterfaceSourcesEntries;

  AddInterfaceEntries(this, config, "INTERFACE_SOURCES",
                      linkInterfaceSourcesEntries);

  std::vector<std::string>::size_type numFilesBefore = files.size();
  bool contextDependentInterfaceSources =
    processSources(this, linkInterfaceSourcesEntries, files, uniqueSrcs,
                   &dagChecker, config, debugSources);

  if (!contextDependentDirectSources &&
      !(contextDependentInterfaceSources && numFilesBefore < files.size())) {
    this->LinkImplementationLanguageIsContextDependent = false;
  }

  cmDeleteAll(linkInterfaceSourcesEntries);
}